

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O2

void __thiscall CSR::turntoCSR(CSR *this)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  uint uVar6;
  void *__s;
  void *__s_00;
  void *__s_01;
  void *__s_02;
  ostream *poVar7;
  int i;
  ulong uVar8;
  int i_1;
  ulong uVar9;
  ulong __n;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  lVar15 = (long)this->row;
  uVar8 = 0xffffffffffffffff;
  uVar10 = lVar15 * 4;
  if (lVar15 < 0) {
    uVar10 = uVar8;
  }
  __s = operator_new__(uVar10);
  uVar9 = 0;
  memset(__s,0,uVar10);
  uVar10 = lVar15 * 4 + 4;
  if (lVar15 < -1) {
    uVar10 = uVar8;
  }
  __s_00 = operator_new__(uVar10);
  memset(__s_00,0,uVar10);
  lVar15 = (long)this->nonzero;
  uVar10 = lVar15 * 4;
  if (lVar15 < 0) {
    uVar10 = uVar8;
  }
  __n = lVar15 * 8;
  if (lVar15 < 0) {
    __n = uVar8;
  }
  __s_01 = operator_new__(uVar10);
  memset(__s_01,0,uVar10);
  __s_02 = operator_new__(__n);
  memset(__s_02,0,__n);
  lVar15 = std::chrono::_V2::system_clock::now();
  uVar6 = this->nonzero;
  piVar4 = this->idx;
  uVar8 = 0;
  if (0 < (int)uVar6) {
    uVar8 = (ulong)uVar6;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    piVar1 = (int *)((long)__s + (long)piVar4[uVar9] * 4);
    *piVar1 = *piVar1 + 1;
  }
  uVar2 = this->row;
  uVar8 = 0;
  uVar10 = 0;
  if (0 < (int)uVar2) {
    uVar10 = (ulong)uVar2;
  }
  iVar11 = 0;
  for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    *(int *)((long)__s_00 + uVar8 * 4) = iVar11;
    iVar11 = iVar11 + *(int *)((long)__s + uVar8 * 4);
  }
  *(uint *)((long)__s_00 + (long)(int)uVar2 * 4) = uVar6;
  uVar10 = 0;
  memset(__s,0,(long)(int)uVar2 << 2);
  piVar1 = this->ptr;
  pdVar5 = this->val;
  uVar8 = (ulong)(uint)this->col;
  if (this->col < 1) {
    uVar8 = uVar10;
  }
  while (uVar9 = uVar10, uVar9 != uVar8) {
    iVar11 = piVar1[uVar9 + 1];
    for (lVar12 = (long)piVar1[uVar9]; uVar10 = uVar9 + 1, lVar12 < iVar11; lVar12 = lVar12 + 1) {
      lVar13 = (long)piVar4[lVar12];
      iVar3 = *(int *)((long)__s + lVar13 * 4);
      lVar14 = (long)*(int *)((long)__s_00 + lVar13 * 4) + (long)iVar3;
      *(int *)((long)__s_01 + lVar14 * 4) = (int)uVar9;
      *(double *)((long)__s_02 + lVar14 * 8) = pdVar5[lVar12];
      *(int *)((long)__s + lVar13 * 4) = iVar3 + 1;
    }
  }
  lVar12 = std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"execution time (turn to CSR2):");
  poVar7 = std::ostream::_M_insert<double>((double)(lVar12 - lVar15) / 1000000000.0);
  std::operator<<(poVar7,"\n");
  piVar4 = this->ptr;
  for (lVar15 = 0; lVar15 <= this->row; lVar15 = lVar15 + 1) {
    piVar4[lVar15] = *(int *)((long)__s_00 + lVar15 * 4);
  }
  uVar6 = this->nonzero;
  pdVar5 = this->val;
  uVar8 = 0;
  uVar10 = 0;
  if (0 < (int)uVar6) {
    uVar10 = (ulong)uVar6;
  }
  for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    pdVar5[uVar8] = *(double *)((long)__s_02 + uVar8 * 8);
  }
  piVar4 = this->idx;
  for (lVar15 = 0; lVar15 < (int)uVar6; lVar15 = lVar15 + 1) {
    piVar4[lVar15] = *(int *)((long)__s_01 + lVar15 * 4);
    uVar6 = this->nonzero;
  }
  operator_delete__(__s);
  operator_delete__(__s_01);
  operator_delete__(__s_00);
  operator_delete__(__s_02);
  return;
}

Assistant:

void  CSR::turntoCSR()
{
    int *rowCnt= new int [row]();
    int *ptrR = new int[row+1]();
    int counter = 0;
    int *colIdx = new int[nonzero]();
    double *valR = new double [nonzero]();

    //
  //  int *idxR = new int[nonzero]();
  //
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    start = std::chrono::system_clock::now();
    for(int i=0; i<nonzero; i++)
    {
        rowCnt[idx[i]]++;
    }
    for(int i=0; i<row; i++)
    {
        ptrR[i] = counter;
        counter += rowCnt[i];
    }
    ptrR[row] = nonzero;
    memset(rowCnt, 0, sizeof(int) * row);//makes zero all elements of rowCtn
    for(int i=0; i<col; i++)
    {
        for(int j= ptr[i]; j<ptr[i+1]; j++)
        {
           int r = idx[j];
           int index = rowCnt[r]+ptrR[r];
           colIdx[index] = i;
           valR[index] = val[j];
           rowCnt[r]++;
        }
    }
    end = std::chrono::system_clock::now();
    elapsed_seconds = end - start;
    double durationSym1 = elapsed_seconds.count();
    cout << "execution time (turn to CSR2):" << durationSym1 << "\n";

    for(int i=0; i<row+1; i++)
    {
        ptr[i] = ptrR[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        val[i] = valR[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        idx[i] = colIdx[i];
    }

    delete []rowCnt;
    delete []colIdx;
    delete []ptrR;
    delete []valR;
}